

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcRationalBezierCurve *in;
  
  in = (IfcRationalBezierCurve *)operator_new(0x100);
  *(undefined ***)&in->field_0xe8 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0xf0 = 0;
  *(char **)&in->field_0xf8 = "IfcRationalBezierCurve";
  Assimp::IFC::Schema_2x3::IfcBezierCurve::IfcBezierCurve
            ((IfcBezierCurve *)in,&PTR_construction_vtable_24__008c8000);
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined ***)in = &PTR__IfcRationalBezierCurve_008c7ed0;
  *(undefined ***)&in->field_0xe8 = &PTR__IfcRationalBezierCurve_008c7fe8;
  *(undefined ***)&in->field_0x10 = &PTR__IfcRationalBezierCurve_008c7ef8;
  *(undefined ***)&in->field_0x20 = &PTR__IfcRationalBezierCurve_008c7f20;
  *(undefined ***)&in->field_0x30 = &PTR__IfcRationalBezierCurve_008c7f48;
  *(undefined ***)&in->field_0x40 = &PTR__IfcRationalBezierCurve_008c7f70;
  *(undefined ***)&in->field_0xb0 = &PTR__IfcRationalBezierCurve_008c7f98;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>)._vptr_ObjectHelper
       = (_func_int **)&PTR__IfcRationalBezierCurve_008c7fc0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).field_0x10 = 0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).field_0x18 = 0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).field_0x20 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve>(db,params,in);
  return (Object *)(&in->field_0x0 + *(long *)(*(long *)in + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }